

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeTypeFunction(ExpressionContext *ctx,SynTypeFunction *syntax)

{
  Allocator *pAVar1;
  TypeBase *pTVar2;
  SynBase *value;
  SynCallArgument *pSVar3;
  SynCallArgument *pSVar4;
  int iVar5;
  int iVar6;
  TypeBase *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SynFunctionCall *syntax_00;
  ExprBase *pEVar8;
  IntrusiveList<SynBase> *pIVar9;
  IntrusiveList<SynCallArgument> arguments;
  undefined4 extraout_var_02;
  
  pTVar7 = AnalyzeType(ctx,&syntax->super_SynBase,false,(bool *)0x0);
  pAVar1 = ctx->allocator;
  if (pTVar7 == (TypeBase *)0x0) {
    iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x48);
    SynTypeReference::SynTypeReference
              ((SynTypeReference *)CONCAT44(extraout_var_00,iVar5),(syntax->super_SynBase).begin,
               (syntax->super_SynBase).end,syntax->returnType);
    arguments.head = (SynCallArgument *)0x0;
    arguments.tail = (SynCallArgument *)0x0;
    pIVar9 = &syntax->arguments;
    while( true ) {
      value = pIVar9->head;
      pAVar1 = ctx->allocator;
      if (value == (SynBase *)0x0) break;
      iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x50);
      SynCallArgument::SynCallArgument
                ((SynCallArgument *)CONCAT44(extraout_var_01,iVar6),value->begin,value->end,
                 (SynIdentifier *)0x0,value);
      IntrusiveList<SynCallArgument>::push_back
                (&arguments,(SynCallArgument *)CONCAT44(extraout_var_01,iVar6));
      pIVar9 = (IntrusiveList<SynBase> *)&value->next;
    }
    iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x68);
    pSVar4 = arguments.tail;
    pSVar3 = arguments.head;
    syntax_00 = (SynFunctionCall *)CONCAT44(extraout_var_02,iVar6);
    SynBase::SynBase((SynBase *)syntax_00,0x1a,(syntax->super_SynBase).begin,
                     (syntax->super_SynBase).end);
    (syntax_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002227a0;
    syntax_00->value = (SynBase *)CONCAT44(extraout_var_00,iVar5);
    (syntax_00->aliases).head = (SynBase *)0x0;
    (syntax_00->aliases).tail = (SynBase *)0x0;
    (syntax_00->arguments).head = pSVar3;
    (syntax_00->arguments).tail = pSVar4;
    pEVar8 = AnalyzeFunctionCall(ctx,syntax_00);
  }
  else {
    iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pTVar2 = ctx->typeTypeID;
    pEVar8->typeID = 8;
    pEVar8->source = &syntax->super_SynBase;
    pEVar8->type = pTVar2;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223560;
    pEVar8[1]._vptr_ExprBase = (_func_int **)pTVar7;
  }
  return pEVar8;
}

Assistant:

ExprBase* AnalyzeTypeFunction(ExpressionContext &ctx, SynTypeFunction *syntax)
{
	if(TypeBase *type = AnalyzeType(ctx, syntax, false))
		return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, type);

	// Transform 'type ref(arguments)' into a 'type ref' constructor call
	SynBase* value = new (ctx.get<SynTypeReference>()) SynTypeReference(syntax->begin, syntax->end, syntax->returnType);

	IntrusiveList<SynCallArgument> arguments;

	for(SynBase *curr = syntax->arguments.head; curr; curr = curr->next)
		arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(curr->begin, curr->end, NULL, curr));

	return AnalyzeFunctionCall(ctx, new (ctx.get<SynFunctionCall>()) SynFunctionCall(syntax->begin, syntax->end, value, IntrusiveList<SynBase>(), arguments));
}